

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandDebugType
          (ValidationState_t *_,string *debug_inst_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name,bool allow_template_param)

{
  pointer puVar1;
  bool bVar2;
  Instruction *pIVar3;
  spv_result_t sVar4;
  bool allow_template_param_local;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  function<bool_(NonSemanticShaderDebugInfo100Instructions)> expectation;
  spv_result_t local_38;
  
  allow_template_param_local = allow_template_param;
  if ((inst->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    expectation.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    expectation.super__Function_base._M_functor._8_8_ = 0;
    expectation._M_invoker =
         std::
         _Function_handler<bool_(NonSemanticShaderDebugInfo100Instructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:258:9)>
         ::_M_invoke;
    expectation.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(NonSemanticShaderDebugInfo100Instructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:258:9)>
         ::_M_manager;
    puVar1 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)word_index <
        (ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
      pIVar3 = ValidationState_t::FindDef(_,puVar1[word_index]);
      bVar2 = spvIsExtendedInstruction((uint)(pIVar3->inst_).opcode);
      if ((bVar2) &&
         ((pIVar3->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)) {
        bVar2 = std::function<bool_(NonSemanticShaderDebugInfo100Instructions)>::operator()
                          (&expectation,
                           (pIVar3->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[4]);
        if (expectation.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*expectation.super__Function_base._M_manager)
                    ((_Any_data *)&expectation,(_Any_data *)&expectation,__destroy_functor);
        }
        if (bVar2) {
          return SPV_SUCCESS;
        }
        goto LAB_001af916;
      }
    }
    std::
    _Function_handler<bool_(NonSemanticShaderDebugInfo100Instructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:258:9)>
    ::_M_manager((_Any_data *)&expectation,(_Any_data *)&expectation,__destroy_functor);
  }
LAB_001af916:
  local_248._8_8_ = 0;
  local_248._M_unused._M_object = &allow_template_param_local;
  local_230 = std::
              _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:267:7)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_extensions.cpp:267:7)>
              ::_M_manager;
  bVar2 = DoesDebugInfoOperandMatchExpectation
                    (_,(function<bool_(CommonDebugInfoInstructions)> *)&local_248,inst,word_index);
  sVar4 = SPV_SUCCESS;
  if (!bVar2) {
    ValidationState_t::diag((DiagnosticStream *)&expectation,_,SPV_ERROR_INVALID_DATA,inst);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&local_228,ext_inst_name);
    std::operator<<((ostream *)&expectation,(string *)&local_228);
    std::operator<<((ostream *)&expectation,": ");
    std::operator<<((ostream *)&expectation,"expected operand ");
    std::operator<<((ostream *)&expectation,(string *)debug_inst_name);
    std::operator<<((ostream *)&expectation," is not a valid debug type");
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&expectation);
    sVar4 = local_38;
  }
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  return sVar4;
}

Assistant:

spv_result_t ValidateOperandDebugType(
    ValidationState_t& _, const std::string& debug_inst_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name,
    bool allow_template_param) {
  // Check for NonSemanticShaderDebugInfo100 specific types.
  if (inst->ext_inst_type() ==
      SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    std::function<bool(NonSemanticShaderDebugInfo100Instructions)> expectation =
        [](NonSemanticShaderDebugInfo100Instructions dbg_inst) {
          return dbg_inst == NonSemanticShaderDebugInfo100DebugTypeMatrix;
        };
    if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
      return SPV_SUCCESS;
  }

  // Check for common types.
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [&allow_template_param](CommonDebugInfoInstructions dbg_inst) {
        if (allow_template_param &&
            (dbg_inst == CommonDebugInfoDebugTypeTemplateParameter ||
             dbg_inst == CommonDebugInfoDebugTypeTemplateTemplateParameter)) {
          return true;
        }
        return CommonDebugInfoDebugTypeBasic <= dbg_inst &&
               dbg_inst <= CommonDebugInfoDebugTypeTemplate;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name
         << " is not a valid debug type";
}